

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

void Au_ManReorderModels_rec(Au_Ntk_t *pNtk,Vec_Int_t *vOrder)

{
  void *pvVar1;
  ulong uVar2;
  long lVar3;
  Au_Ntk_t *pNtk_00;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  
  if (pNtk->fMark != 0) {
    return;
  }
  pNtk->fMark = 1;
  iVar4 = (pNtk->vObjs).nSize;
  if (0 < iVar4) {
    lVar8 = 0;
    do {
      lVar5 = (long)iVar4;
      if (lVar5 <= lVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar6 = (pNtk->vObjs).pArray[lVar8];
      pvVar1 = (pNtk->vPages).pArray[(int)uVar6 >> 0xc];
      uVar7 = (ulong)((uVar6 & 0xfff) << 4);
      uVar2 = *(ulong *)((long)pvVar1 + uVar7);
      if ((uVar2 & 0x700000000) == 0x600000000) {
        lVar3 = *(long *)(*(long *)((long)pvVar1 + uVar7 & 0xfffffffffffffc00) + 8);
        uVar6 = (uint)uVar2;
        if (*(int *)(lVar3 + 0xc) <= (int)(uVar6 & 0x3fffffff)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pNtk_00 = *(Au_Ntk_t **)(*(long *)(lVar3 + 0x10) + (ulong)(uVar6 & 0x3fffffff) * 8);
        if (pNtk_00 != pNtk && pNtk_00 != (Au_Ntk_t *)0x0) {
          Au_ManReorderModels_rec(pNtk_00,vOrder);
          iVar4 = (pNtk->vObjs).nSize;
          lVar5 = (long)iVar4;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < lVar5);
  }
  Vec_IntPush(vOrder,pNtk->Id);
  return;
}

Assistant:

void Au_ManReorderModels_rec( Au_Ntk_t * pNtk, Vec_Int_t * vOrder )
{
    Au_Ntk_t * pBoxModel;
    Au_Obj_t * pObj;
    int k;
    if ( pNtk->fMark )
        return;
    pNtk->fMark = 1;
    Au_NtkForEachBox( pNtk, pObj, k )
    {
        pBoxModel = Au_ObjModel(pObj);
        if ( pBoxModel == NULL || pBoxModel == pNtk )
            continue;
        Au_ManReorderModels_rec( pBoxModel, vOrder );
    }
    Vec_IntPush( vOrder, pNtk->Id );
}